

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_state_callback_clear(callback_type_e c_type)

{
  fio_ls_embd_s *pfVar1;
  callback_collection_s *pcVar2;
  fio_lock_i fVar3;
  fio_ls_embd_s *pfVar4;
  fio_ls_embd_s *pfVar5;
  fio_ls_embd_s *__ptr;
  fio_lock_i ret;
  timespec local_28;
  
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK)) {
    pcVar2 = callback_collection + c_type;
    LOCK();
    fVar3 = pcVar2->lock;
    pcVar2->lock = '\x01';
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar3);
    while (fVar3 != '\0') {
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      fVar3 = pcVar2->lock;
      pcVar2->lock = '\x01';
      UNLOCK();
      local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar3);
    }
    __ptr = callback_collection[c_type].callbacks.next;
    pfVar1 = &callback_collection[c_type].callbacks;
    if (__ptr == (fio_ls_embd_s *)0x0) {
      callback_collection[c_type].callbacks.prev = pfVar1;
      callback_collection[c_type].callbacks.next = pfVar1;
    }
    else {
      while (__ptr != pfVar1) {
        pfVar4 = __ptr->next;
        if (pfVar4 == __ptr || pfVar4 == (fio_ls_embd_s *)0x0) {
          __ptr = (fio_ls_embd_s *)0x0;
        }
        else {
          pfVar5 = __ptr->prev;
          pfVar4->prev = pfVar5;
          pfVar5->next = pfVar4;
          __ptr->next = __ptr;
          __ptr->prev = __ptr;
        }
        free(__ptr);
        __ptr = callback_collection[c_type].callbacks.next;
      }
    }
    LOCK();
    pcVar2->lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_state_callback_clear(callback_type_e c_type) {
  if ((int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  while (fio_ls_embd_any(&callback_collection[c_type].callbacks)) {
    callback_data_s *tmp = FIO_LS_EMBD_OBJ(
        callback_data_s, node,
        fio_ls_embd_shift(&callback_collection[c_type].callbacks));
    free(tmp);
  }
  fio_unlock(&callback_collection[c_type].lock);
}